

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O3

int can_twoweapon(void)

{
  byte bVar1;
  byte bVar2;
  boolean bVar3;
  char *pcVar4;
  char *pcVar5;
  obj *poVar6;
  char *pcVar7;
  char kbuf [256];
  char local_128 [264];
  
  if ((youmonst.data)->mattk[1].aatyp != 0xfe) {
    if ((((youmonst.data)->mflags1 & 0x2000) != 0) || ((youmonst.data)->msize == '\0')) {
      pcVar4 = "Don\'t be ridiculous!";
      goto LAB_002880dd;
    }
    if (u.umonnum != u.umonster) {
      pcVar4 = "You can\'t use two weapons in your current form.";
      goto LAB_002880dd;
    }
    local_128[0] = '\0';
    if (u.weapon_skills[0x26].max_skill < '\x02') {
      pcVar4 = urole.name.f;
      if (urole.name.f == (char *)0x0) {
        pcVar4 = urole.name.m;
      }
      if (flags.female == '\0') {
        pcVar4 = urole.name.m;
      }
      strcat(local_128,pcVar4);
    }
    else {
      strcpy(local_128,urace.noun);
    }
    pcVar4 = upstart(local_128);
    pcVar4 = makeplural(pcVar4);
    pcVar5 = "%s aren\'t able to use two weapons at once.";
    goto LAB_002882ce;
  }
  if (uwep == (obj *)0x0 || uswapwep == (obj *)0x0) {
    pcVar4 = "";
    if (uswapwep != (obj *)0x0) {
      pcVar4 = "right ";
    }
    pcVar5 = "left ";
    if (uwep == (obj *)0x0) {
      pcVar5 = pcVar4;
    }
    pcVar4 = body_part(6);
    pcVar7 = " is";
    if (uswapwep == (obj *)0x0 && uwep == (obj *)0x0) {
      pcVar7 = "s are";
    }
    pline("Your %s%s%s empty.",pcVar5,pcVar4,pcVar7);
    return 0;
  }
  bVar1 = uwep->oclass;
  poVar6 = uwep;
  if (bVar1 == 6) {
    if (objects[uwep->otyp].oc_subtyp != '\0') {
LAB_00288155:
      bVar2 = uswapwep->oclass;
      if ((bVar2 == 2) || ((bVar2 == 6 && (objects[uswapwep->otyp].oc_subtyp != '\0')))) {
        if ((((bVar1 | 4) == 6) && ((objects[uwep->otyp].field_0x11 & 1) != 0)) ||
           (((bVar2 | 4) == 6 && ((objects[uswapwep->otyp].field_0x11 & 1) != 0)))) {
          if (((bVar1 | 4) != 6) || ((objects[uwep->otyp].field_0x11 & 1) == 0)) {
            poVar6 = uswapwep;
          }
          pcVar4 = Yname2(poVar6);
          pcVar5 = "%s isn\'t one-handed.";
LAB_002882ce:
          pline(pcVar5,pcVar4);
          return 0;
        }
        if (uarms != (obj *)0x0) {
          pcVar4 = "You can\'t use two weapons while wearing a shield.";
LAB_002880dd:
          pline(pcVar4);
          return 0;
        }
        if (uswapwep->oartifact == '\0') {
          if ((((uarmg != (obj *)0x0) || (u.uprops[8].extrinsic != 0)) ||
              (((byte)youmonst.mintrinsics & 0x80) != 0)) ||
             ((uswapwep->otyp != 0x10e || (1 < uswapwep->corpsenm - 0xbU)))) {
            if (u.uprops[0x29].intrinsic == 0) {
              if ((*(uint *)&uswapwep->field_0x4a & 1) == 0) {
                return 1;
              }
              *(uint *)&uswapwep->field_0x4a = *(uint *)&uswapwep->field_0x4a | 0x40;
            }
            drop_uswapwep();
            return 0;
          }
          pcVar4 = mons_mname(mons + (uint)uswapwep->corpsenm);
          pcVar5 = body_part(6);
          pline("You wield the %s corpse with your bare %s.",pcVar4,pcVar5);
          pcVar4 = mons_mname(mons + uswapwep->corpsenm);
          pcVar4 = an(pcVar4);
          sprintf(local_128,"%s corpse",pcVar4);
          bVar3 = delayed_petrify((char *)0x0,local_128);
          if (bVar3 == '\0') {
            return 0;
          }
          pcVar4 = mons_mname(mons + uswapwep->corpsenm);
          pcVar5 = "You release the %s corpse!";
          goto LAB_002882ce;
        }
        pcVar4 = Yname2(uswapwep);
        pcVar5 = otense(uswapwep,"resist");
        pcVar7 = "%s %s being held second to another weapon!";
        goto LAB_00288257;
      }
      if (bVar1 == 6) {
        if (objects[uwep->otyp].oc_subtyp != '\0') {
LAB_0028821b:
          poVar6 = uswapwep;
        }
      }
      else if (bVar1 == 2) goto LAB_0028821b;
    }
  }
  else if (bVar1 == 2) goto LAB_00288155;
  pcVar4 = Yname2(poVar6);
  if (poVar6->quan < 2) {
    pcVar5 = "isn\'t a weapon";
    if (poVar6->oartifact == '\x1d') {
      pcVar5 = "aren\'t weapons";
    }
  }
  else {
    pcVar5 = "aren\'t weapons";
  }
  pcVar7 = "%s %s.";
LAB_00288257:
  pline(pcVar7,pcVar4,pcVar5);
  return 0;
}

Assistant:

int can_twoweapon(void)
{
	struct obj *otmp;

#define NOT_WEAPON(obj) (!is_weptool(obj) && obj->oclass != WEAPON_CLASS)
	if (!could_twoweap(youmonst.data)) {
		if (cantwield(youmonst.data)) {
		    pline("Don't be ridiculous!");
		} else if (Upolyd) {
		    pline("You can't use two weapons in your current form.");
		} else {
		    char buf[BUFSZ];
		    boolean disallowed_by_role = P_MAX_SKILL(P_TWO_WEAPON_COMBAT) < P_BASIC;
		    boolean disallowed_by_race = youmonst.data->mattk[1].aatyp != AT_WEAP;
		    buf[0] = '\0';
		    if (!disallowed_by_role)
			strcpy(buf, disallowed_by_race ? urace.noun : urace.adj);
		    if (disallowed_by_role || !disallowed_by_race) {
			if (!disallowed_by_role)
			    strcat(buf, " ");
			strcat(buf, (flags.female && urole.name.f) ?
				    urole.name.f : urole.name.m);
		    }
		    pline("%s aren't able to use two weapons at once.",
			  makeplural(upstart(buf)));
		}
	} else if (!uwep || !uswapwep)
		pline("Your %s%s%s empty.", uwep ? "left " : uswapwep ? "right " : "",
			body_part(HAND), (!uwep && !uswapwep) ? "s are" : " is");
	else if (NOT_WEAPON(uwep) || NOT_WEAPON(uswapwep)) {
		otmp = NOT_WEAPON(uwep) ? uwep : uswapwep;
		pline("%s %s.", Yname2(otmp),
		    is_plural(otmp) ? "aren't weapons" : "isn't a weapon");
	} else if (bimanual(uwep) || bimanual(uswapwep)) {
		otmp = bimanual(uwep) ? uwep : uswapwep;
		pline("%s isn't one-handed.", Yname2(otmp));
	} else if (uarms)
		pline("You can't use two weapons while wearing a shield.");
	else if (uswapwep->oartifact)
		pline("%s %s being held second to another weapon!",
			Yname2(uswapwep), otense(uswapwep, "resist"));
	else if (!uarmg && !Stone_resistance && (uswapwep->otyp == CORPSE &&
		    touch_petrifies(&mons[uswapwep->corpsenm]))) {
		char kbuf[BUFSZ];

		pline("You wield the %s corpse with your bare %s.",
		    mons_mname(&mons[uswapwep->corpsenm]), body_part(HAND));
		sprintf(kbuf, "%s corpse", an(mons_mname(&mons[uswapwep->corpsenm])));
		if (delayed_petrify(NULL, kbuf)) {
		    pline("You release the %s corpse!",
			  mons_mname(&mons[uswapwep->corpsenm]));
		}
	} else if (Glib || uswapwep->cursed) {
		if (!Glib)
			uswapwep->bknown = TRUE;
		drop_uswapwep();
	} else
		return TRUE;
	return FALSE;
}